

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswAig.c
# Opt level: O3

Aig_Man_t * Ssw_SpeculativeReduction(Ssw_Man_t *p)

{
  char *__s;
  void *pvVar1;
  Aig_Man_t *p_00;
  size_t sVar2;
  char *__dest;
  Aig_Obj_t *pAVar3;
  Aig_Man_t *pAVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  Vec_Ptr_t *pVVar8;
  Aig_Obj_t *p1;
  int iVar9;
  Aig_Obj_t *pAVar10;
  long lVar11;
  
  if (p->pFrames != (Aig_Man_t *)0x0) {
    __assert_fail("p->pFrames == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0xd9,"Aig_Man_t *Ssw_SpeculativeReduction(Ssw_Man_t *)");
  }
  pAVar4 = p->pAig;
  if (pAVar4->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0xda,"Aig_Man_t *Ssw_SpeculativeReduction(Ssw_Man_t *)");
  }
  if (pAVar4->nObjs[2] <= pAVar4->nRegs) {
    __assert_fail("Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0xdb,"Aig_Man_t *Ssw_SpeculativeReduction(Ssw_Man_t *)");
  }
  p->nConstrTotal = 0;
  p->nConstrReduced = 0;
  p_00 = Aig_ManStart(p->nFrames * pAVar4->vObjs->nSize);
  pAVar4 = p->pAig;
  __s = pAVar4->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar2 = strlen(__s);
    __dest = (char *)malloc(sVar2 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  p->pNodeToFrames[(long)pAVar4->pConst1->Id * (long)p->nFrames] = p_00->pConst1;
  pAVar4 = p->pAig;
  if (0 < pAVar4->nTruePis) {
    lVar11 = 0;
    do {
      if (pAVar4->vCis->nSize <= lVar11) goto LAB_005e0a61;
      pvVar1 = pAVar4->vCis->pArray[lVar11];
      pAVar3 = Aig_ObjCreateCi(p_00);
      p->pNodeToFrames[(long)*(int *)((long)pvVar1 + 0x24) * (long)p->nFrames] = pAVar3;
      lVar11 = lVar11 + 1;
      pAVar4 = p->pAig;
    } while (lVar11 < pAVar4->nTruePis);
  }
  if (0 < pAVar4->nRegs) {
    iVar9 = 0;
    do {
      uVar7 = pAVar4->nTruePis + iVar9;
      if (((int)uVar7 < 0) || (pAVar4->vCis->nSize <= (int)uVar7)) goto LAB_005e0a61;
      pvVar1 = pAVar4->vCis->pArray[uVar7];
      pAVar3 = Aig_ObjCreateCi(p_00);
      p->pNodeToFrames[(long)*(int *)((long)pvVar1 + 0x24) * (long)p->nFrames] = pAVar3;
      iVar9 = iVar9 + 1;
      pAVar4 = p->pAig;
    } while (iVar9 < pAVar4->nRegs);
    if (0 < pAVar4->nRegs) {
      iVar9 = 0;
      do {
        uVar7 = pAVar4->nTruePis + iVar9;
        if (((int)uVar7 < 0) || (pAVar4->vCis->nSize <= (int)uVar7)) goto LAB_005e0a61;
        Ssw_FramesConstrainNode
                  (p,p_00,(Aig_Man_t *)pAVar4->pReprs,(Aig_Obj_t *)pAVar4->vCis->pArray[uVar7],0,0);
        iVar9 = iVar9 + 1;
        pAVar4 = p->pAig;
      } while (iVar9 < pAVar4->nRegs);
    }
  }
  pVVar8 = pAVar4->vObjs;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      pAVar3 = (Aig_Obj_t *)pVVar8->pArray[lVar11];
      if ((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)) {
        if (((ulong)pAVar3 & 1) != 0) goto LAB_005e0a80;
        uVar5 = (ulong)pAVar3->pFanin0 & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          pAVar10 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar10 = (Aig_Obj_t *)
                    ((ulong)((uint)pAVar3->pFanin0 & 1) ^
                    (ulong)p->pNodeToFrames[(long)*(int *)(uVar5 + 0x24) * (long)p->nFrames]);
        }
        uVar5 = (ulong)pAVar3->pFanin1 & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)pAVar3->pFanin1 & 1) ^
               (ulong)p->pNodeToFrames[(long)*(int *)(uVar5 + 0x24) * (long)p->nFrames]);
        }
        pAVar10 = Aig_And(p_00,pAVar10,p1);
        p->pNodeToFrames[(long)pAVar3->Id * (long)p->nFrames] = pAVar10;
        Ssw_FramesConstrainNode(p,p_00,(Aig_Man_t *)p->pAig->pReprs,pAVar3,0,0);
        pAVar4 = p->pAig;
      }
      lVar11 = lVar11 + 1;
      pVVar8 = pAVar4->vObjs;
    } while (lVar11 < pVVar8->nSize);
  }
  if (0 < pAVar4->nRegs) {
    iVar9 = 0;
    do {
      uVar7 = pAVar4->nTruePos + iVar9;
      if (((int)uVar7 < 0) || (pAVar4->vCos->nSize <= (int)uVar7)) {
LAB_005e0a61:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = pAVar4->vCos->pArray[uVar7];
      if (((ulong)pvVar1 & 1) != 0) {
LAB_005e0a80:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswInt.h"
                      ,0xb9,"Aig_Obj_t *Ssw_ObjChild0Fra(Ssw_Man_t *, Aig_Obj_t *, int)");
      }
      uVar5 = *(ulong *)((long)pvVar1 + 8);
      uVar6 = uVar5 & 0xfffffffffffffffe;
      if (uVar6 == 0) {
        pAVar3 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar3 = (Aig_Obj_t *)
                 ((ulong)((uint)uVar5 & 1) ^
                 (ulong)p->pNodeToFrames[(long)*(int *)(uVar6 + 0x24) * (long)p->nFrames]);
      }
      Aig_ObjCreateCo(p_00,pAVar3);
      iVar9 = iVar9 + 1;
      pAVar4 = p->pAig;
    } while (iVar9 < pAVar4->nRegs);
  }
  Aig_ManCleanup(p_00);
  Aig_ManSetRegNum(p_00,p->pAig->nRegs);
  return p_00;
}

Assistant:

Aig_Man_t * Ssw_SpeculativeReduction( Ssw_Man_t * p )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjNew;
    int i;
    assert( p->pFrames == NULL );
    assert( Aig_ManRegNum(p->pAig) > 0 );
    assert( Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig) );
    p->nConstrTotal = p->nConstrReduced = 0;

    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->nFrames );
    pFrames->pName = Abc_UtilStrsav( p->pAig->pName );
    // map constants and PIs
    Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), 0, Aig_ManConst1(pFrames) );
    Saig_ManForEachPi( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ObjCreateCi(pFrames) );
    // create latches for the first frame
    Saig_ManForEachLo( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ObjCreateCi(pFrames) );
    // set the constraints on the latch outputs
    Saig_ManForEachLo( p->pAig, pObj, i )
        Ssw_FramesConstrainNode( p, pFrames, p->pAig, pObj, 0, 0 );
    // add internal nodes of this frame
    Aig_ManForEachNode( p->pAig, pObj, i )
    {
        pObjNew = Aig_And( pFrames, Ssw_ObjChild0Fra(p, pObj, 0), Ssw_ObjChild1Fra(p, pObj, 0) );
        Ssw_ObjSetFrame( p, pObj, 0, pObjNew );
        Ssw_FramesConstrainNode( p, pFrames, p->pAig, pObj, 0, 0 );
    }
    // add the POs for the latch outputs of the last frame
    Saig_ManForEachLi( p->pAig, pObj, i )
        Aig_ObjCreateCo( pFrames, Ssw_ObjChild0Fra(p, pObj,0) );
    // remove dangling nodes
    Aig_ManCleanup( pFrames );
    Aig_ManSetRegNum( pFrames, Aig_ManRegNum(p->pAig) );
//    Abc_Print( 1, "SpecRed: Total constraints = %d. Reduced constraints = %d.\n", 
//        p->nConstrTotal, p->nConstrReduced );
    return pFrames;
}